

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::createTempFile(StringRef *dir,StringRef *prefix)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int __fd;
  C *__template;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  String *in_RDI;
  int fd;
  String fileName;
  undefined4 in_stack_ffffffffffffff38;
  utf32_t in_stack_ffffffffffffff3c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff50;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> local_78 [2];
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_38;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_18;
  
  local_18 = in_RDX;
  bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RSI);
  if (bVar1) {
    in_stack_ffffffffffffff50 = local_78;
    getTempDir();
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffff40,
               (StringRef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffff40,
               (StringRef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (in_stack_ffffffffffffff50,
             (StringRef *)
             CONCAT17(in_stack_ffffffffffffff4f,
                      CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d4fb);
  if (bVar1) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d50e);
  }
  uVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isSuffix(&local_38,'/');
  if (!(bool)uVar2) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff3c);
  }
  uVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(local_18);
  if ((bool)uVar3) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff40,
               (C *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff40,
               (StringRef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff40,
               (C *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  __template = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::p
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          in_stack_ffffffffffffff40);
  __fd = mkstemp(__template);
  if (__fd == -1) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d647);
  }
  else {
    ::close(__fd);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (in_stack_ffffffffffffff50,
               (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
               CONCAT17(uVar2,CONCAT16(uVar3,in_stack_ffffffffffffff48)));
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d687);
  return in_RDI;
}

Assistant:

sl::String
createTempFile(
	const sl::StringRef& dir,
	const sl::StringRef& prefix
) {
#if (_AXL_OS_WIN)
	wchar_t buffer_w[MAX_PATH + 1];
	::GetTempFileNameW(
		!dir.isEmpty() ? dir.s2().sz() : getTempDir_w().sz(),
		prefix.s2().szn(),
		0,
		buffer_w
	);

	return buffer_w;
#else
	sl::String fileName = !dir.isEmpty() ? dir : getTempDir();
	if (!fileName.isSuffix('/'))
		fileName += '/';

	if (!prefix.isEmpty()) {
		fileName += prefix;
		fileName += "XXXXXX";
	} else {
		fileName += "tmpXXXXXX";
	}

	int fd = ::mkstemp(fileName.p());
	if (fd == -1)
		return sl::String();

	close(fd);
	return fileName;
#endif
}